

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O1

bool __thiscall AInventory::CanPickup(AInventory *this,AActor *toucher)

{
  PClass *pPVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PClass *pPVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  if (toucher == (AActor *)0x0) {
    bVar6 = false;
  }
  else {
    if ((this->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
      iVar3 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
      (this->super_AActor).super_DThinker.super_DObject.Class =
           (PClass *)CONCAT44(extraout_var,iVar3);
    }
    pPVar1 = (this->super_AActor).super_DThinker.super_DObject.Class;
    if (*(int *)((long)&pPVar1[2].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                        super_DObject.GCNext + 4) == 0) {
      bVar6 = *(int *)&pPVar1[2].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                       field_0x2c == 0;
      if (!bVar6) {
        uVar5 = 0;
        do {
          pPVar2 = *(PClass **)
                    (*(long *)&pPVar1[2].super_PStruct.super_PNamedType.super_PCompoundType.
                               super_PType.super_DObject.ObjectFlags + uVar5 * 8);
          if ((toucher->super_DThinker).super_DObject.Class == (PClass *)0x0) {
            iVar3 = (**(toucher->super_DThinker).super_DObject._vptr_DObject)(toucher);
            (toucher->super_DThinker).super_DObject.Class =
                 (PClass *)CONCAT44(extraout_var_01,iVar3);
          }
          pPVar4 = (toucher->super_DThinker).super_DObject.Class;
          bVar7 = pPVar4 != (PClass *)0x0;
          if (pPVar4 != pPVar2 && bVar7) {
            do {
              pPVar4 = pPVar4->ParentClass;
              bVar7 = pPVar4 != (PClass *)0x0;
              if (pPVar4 == pPVar2) break;
            } while (pPVar4 != (PClass *)0x0);
          }
          if (bVar7) {
            return bVar6;
          }
          uVar5 = uVar5 + 1;
          bVar7 = uVar5 < *(uint *)&pPVar1[2].super_PStruct.super_PNamedType.super_PCompoundType.
                                    super_PType.field_0x2c;
          bVar6 = !bVar7;
        } while (bVar7);
      }
    }
    else {
      bVar6 = *(int *)((long)&pPVar1[2].super_PStruct.super_PNamedType.super_PCompoundType.
                              super_PType.super_DObject.GCNext + 4) != 0;
      if (bVar6) {
        uVar5 = 0;
        do {
          pPVar2 = (PClass *)
                   (&(pPVar1[2].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                      super_DObject.ObjNext)->_vptr_DObject)[uVar5];
          if ((toucher->super_DThinker).super_DObject.Class == (PClass *)0x0) {
            iVar3 = (**(toucher->super_DThinker).super_DObject._vptr_DObject)(toucher);
            (toucher->super_DThinker).super_DObject.Class =
                 (PClass *)CONCAT44(extraout_var_00,iVar3);
          }
          pPVar4 = (toucher->super_DThinker).super_DObject.Class;
          bVar7 = pPVar4 != (PClass *)0x0;
          if (pPVar4 != pPVar2 && bVar7) {
            do {
              pPVar4 = pPVar4->ParentClass;
              bVar7 = pPVar4 != (PClass *)0x0;
              if (pPVar4 == pPVar2) break;
            } while (pPVar4 != (PClass *)0x0);
          }
          if (bVar7) {
            return bVar6;
          }
          uVar5 = uVar5 + 1;
          bVar6 = uVar5 < *(uint *)((long)&pPVar1[2].super_PStruct.super_PNamedType.
                                           super_PCompoundType.super_PType.super_DObject.GCNext + 4)
          ;
        } while (bVar6);
      }
    }
  }
  return bVar6;
}

Assistant:

bool AInventory::CanPickup (AActor *toucher)
{
	if (!toucher)
		return false;

	PClassInventory *ai = GetClass();
	// Is the item restricted to certain player classes?
	if (ai->RestrictedToPlayerClass.Size() != 0)
	{
		for (unsigned i = 0; i < ai->RestrictedToPlayerClass.Size(); ++i)
		{
			if (toucher->IsKindOf(ai->RestrictedToPlayerClass[i]))
				return true;
		}
		return false;
	}
	// Or is it forbidden to certain other classes?
	else
	{
		for (unsigned i = 0; i < ai->ForbiddenToPlayerClass.Size(); ++i)
		{
			if (toucher->IsKindOf(ai->ForbiddenToPlayerClass[i]))
				return false;
		}
	}
	return true;
}